

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O2

void __thiscall LiteScript::ClassObject::AddMember(ClassObject *this,char *name,Variable *v)

{
  allocator local_71;
  Variable local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
  local_40;
  
  std::__cxx11::string::string((string *)&local_60,name,&local_71);
  Variable::Variable(&local_70,v);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable,_true>
            (&local_40,&local_60,&local_70);
  std::
  vector<std::pair<std::__cxx11::string,LiteScript::Variable>,std::allocator<std::pair<std::__cxx11::string,LiteScript::Variable>>>
  ::emplace_back<std::pair<std::__cxx11::string,LiteScript::Variable>>
            ((vector<std::pair<std::__cxx11::string,LiteScript::Variable>,std::allocator<std::pair<std::__cxx11::string,LiteScript::Variable>>>
              *)this,&local_40);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
  ::~pair(&local_40);
  Variable::~Variable(&local_70);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void LiteScript::ClassObject::AddMember(const char *name, const Variable &v) {
    this->members.push_back({ std::string(name), Variable(v) });
}